

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_m2vd_vdpu2.c
# Opt level: O2

MPP_RET hal_m2vd_vdpu2_start(void *hal,HalTaskInfo *task)

{
  void *pvVar1;
  MPP_RET MVar2;
  MPP_RET MVar3;
  char *fmt;
  MppDevRegRdCfg rd_cfg;
  MppDevRegWrCfg wr_cfg;
  
  if (((byte)m2vh_debug & 1) != 0) {
    _mpp_log_l(4,"hal_m2vd_vdpu2","%s: line(%d), func(%s)",(char *)0x0,"enter\n",0x14f,
               "hal_m2vd_vdpu2_start");
  }
  pvVar1 = *(void **)((long)hal + 0x68);
  wr_cfg.size = 0x27c;
  wr_cfg.offset = 0;
  wr_cfg.reg = pvVar1;
  MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x90),4,&wr_cfg);
  if (MVar2 == MPP_OK) {
    rd_cfg.size = 0x27c;
    rd_cfg.offset = 0;
    rd_cfg.reg = pvVar1;
    MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x90),5,&rd_cfg);
    if (MVar2 == MPP_OK) {
      MVar3 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x90),0xf,(void *)0x0);
      MVar2 = MPP_OK;
      if (MVar3 != MPP_OK) {
        _mpp_log_l(2,"hal_m2vd_vdpu2","send cmd failed %d\n","hal_m2vd_vdpu2_start",
                   (ulong)(uint)MVar3);
        MVar2 = MVar3;
      }
      goto LAB_001f196f;
    }
    fmt = "set register read failed %d\n";
  }
  else {
    fmt = "set register write failed %d\n";
  }
  _mpp_log_l(2,"hal_m2vd_vdpu2",fmt,"hal_m2vd_vdpu2_start",(ulong)(uint)MVar2);
LAB_001f196f:
  if (((byte)m2vh_debug & 1) != 0) {
    _mpp_log_l(4,"hal_m2vd_vdpu2","%s: line(%d), func(%s)",(char *)0x0,"leave\n",0x173,
               "hal_m2vd_vdpu2_start");
  }
  return MVar2;
}

Assistant:

MPP_RET hal_m2vd_vdpu2_start(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_OK;
    M2vdHalCtx *ctx = (M2vdHalCtx *)hal;

    m2vh_dbg_func("enter\n");

    do {
        MppDevRegWrCfg wr_cfg;
        MppDevRegRdCfg rd_cfg;
        RK_U32 *regs = (RK_U32 *)ctx->regs;
        RK_U32 reg_size = sizeof(M2vdVdpu2Reg);

        wr_cfg.reg = regs;
        wr_cfg.size = reg_size;
        wr_cfg.offset = 0;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        rd_cfg.reg = regs;
        rd_cfg.size = reg_size;
        rd_cfg.offset = 0;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_RD, &rd_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_SEND, NULL);
        if (ret) {
            mpp_err_f("send cmd failed %d\n", ret);
            break;
        }
    } while (0);

    (void)task;
    m2vh_dbg_func("leave\n");
    return ret;
}